

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O3

Matrix<double> * __thiscall
nnad::Matrix<double>::operator+
          (Matrix<double> *__return_storage_ptr__,Matrix<double> *this,Matrix<double> *term)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  double dVar4;
  int c;
  int l;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  char *local_58;
  long local_50;
  char local_48 [16];
  double local_38;
  
  local_5c = term->_Lines;
  local_60 = term->_Columns;
  if ((this->_Lines == local_5c) && (this->_Columns == local_60)) {
    local_58 = (char *)CONCAT44(local_58._4_4_,0xffffffff);
    Matrix(__return_storage_ptr__,&local_5c,&local_60,(int *)&local_58);
    local_68 = 0;
    if (0 < local_5c) {
      iVar3 = local_5c;
      iVar1 = local_60;
      do {
        local_64 = 0;
        if (0 < iVar1) {
          do {
            local_38 = (this->_Matrix).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[this->_Columns * local_68 + local_64];
            dVar4 = GetElement(term,&local_68,&local_64);
            local_58 = (char *)(local_38 + dVar4);
            SetElement(__return_storage_ptr__,&local_68,&local_64,(double *)&local_58);
            local_64 = local_64 + 1;
            iVar3 = local_5c;
            iVar1 = local_60;
          } while (local_64 < local_60);
        }
        local_68 = local_68 + 1;
      } while (local_68 < iVar3);
    }
    return __return_storage_ptr__;
  }
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Lines or Columns don\'t match adding the two matrices.","");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[1;31mERROR: ",0xe);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\x1b[0m",4);
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(-10);
}

Assistant:

int GetLines() const
    {
      return _Lines;
    }